

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imstb_rectpack.h
# Opt level: O1

int stbrp_pack_rects(stbrp_context *context,stbrp_rect *rects,int num_rects)

{
  stbrp_rect *psVar1;
  ushort uVar2;
  stbrp_node *psVar3;
  undefined1 auVar4 [16];
  stbrp_context *psVar5;
  int iVar6;
  undefined8 uVar7;
  long extraout_RAX;
  long lVar8;
  int *piVar9;
  int iVar10;
  undefined4 in_register_00000014;
  ulong uVar11;
  uint uVar12;
  stbrp_node **ppsVar13;
  stbrp_node *psVar14;
  stbrp_node **in_R8;
  char *pwaste;
  stbrp_node *psVar15;
  stbrp_context *psVar16;
  int iVar17;
  ulong uVar18;
  stbrp_node **ppsVar19;
  stbrp_context *psVar20;
  bool bVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  int waste;
  int local_98;
  uint local_94;
  stbrp_node **local_90;
  int local_88;
  int local_84;
  ulong local_80;
  undefined8 local_78;
  ulong local_70;
  stbrp_rect *local_68;
  ulong local_60;
  stbrp_context *local_58;
  size_t local_50;
  stbrp_node **local_48;
  ulong local_40;
  stbrp_rect *local_38;
  
  auVar4 = _DAT_00249490;
  local_78 = CONCAT44(in_register_00000014,num_rects);
  uVar18 = (ulong)(uint)num_rects;
  if (0 < num_rects) {
    lVar8 = uVar18 - 1;
    auVar22._8_4_ = (int)lVar8;
    auVar22._0_8_ = lVar8;
    auVar22._12_4_ = (int)((ulong)lVar8 >> 0x20);
    piVar9 = &rects[1].was_packed;
    uVar11 = 0;
    auVar22 = auVar22 ^ _DAT_00249490;
    auVar23 = _DAT_00249480;
    do {
      auVar24 = auVar23 ^ auVar4;
      if ((bool)(~(auVar24._4_4_ == auVar22._4_4_ && auVar22._0_4_ < auVar24._0_4_ ||
                  auVar22._4_4_ < auVar24._4_4_) & 1)) {
        piVar9[-4] = (int)uVar11;
      }
      if ((auVar24._12_4_ != auVar22._12_4_ || auVar24._8_4_ <= auVar22._8_4_) &&
          auVar24._12_4_ <= auVar22._12_4_) {
        *piVar9 = (int)uVar11 + 1;
      }
      uVar11 = uVar11 + 2;
      lVar8 = auVar23._8_8_;
      auVar23._0_8_ = auVar23._0_8_ + 2;
      auVar23._8_8_ = lVar8 + 2;
      piVar9 = piVar9 + 8;
    } while ((num_rects + 1U & 0xfffffffe) != uVar11);
  }
  local_50 = (size_t)num_rects;
  qsort(rects,local_50,0x10,rect_height_compare);
  if (0 < num_rects) {
    ppsVar13 = &context->active_head;
    uVar11 = 0;
    local_90 = in_R8;
    local_58 = context;
    local_48 = ppsVar13;
    local_40 = uVar18;
    local_38 = rects;
    do {
      psVar1 = rects + uVar11;
      uVar2 = rects[uVar11].w;
      if ((uVar2 == 0) || (local_80 = (ulong)psVar1->h, psVar1->h == 0)) {
        psVar1->x = 0;
        psVar1->y = 0;
      }
      else {
        iVar10 = context->align;
        iVar17 = (uint)uVar2 + iVar10 + -1;
        iVar17 = iVar17 - iVar17 % iVar10;
        pwaste = (char *)local_90;
        local_70 = (ulong)uVar2;
        local_68 = psVar1;
        local_60 = uVar11;
        if (iVar17 % iVar10 != 0) {
          pwaste = "width % c->align == 0";
          LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imstb_rectpack.h"
                      ,0x168,"stbrp__skyline_find_best_pos","ImGui ASSERT FAILED: %s");
        }
        if ((context->width < iVar17) || (context->height < (int)local_80)) {
          local_90 = (stbrp_node **)0x0;
          uVar7 = 0;
        }
        else {
          uVar2 = *(ushort *)&((stbrp_context *)*ppsVar13)->width;
          if (context->width < (int)(iVar17 + (uint)uVar2)) {
            local_98 = 0x40000000;
            iVar10 = 0x40000000;
            local_90 = (stbrp_node **)0x0;
          }
          else {
            iVar10 = 0x40000000;
            local_90 = (stbrp_node **)0x0;
            local_98 = 0x40000000;
            psVar16 = (stbrp_context *)*ppsVar13;
            ppsVar19 = ppsVar13;
            do {
              iVar6 = stbrp__skyline_find_min_y
                                (psVar16,(stbrp_node *)(ulong)uVar2,iVar17,(int)&local_84,
                                 (int *)pwaste);
              if (context->heuristic == 0) {
                if (iVar6 < iVar10) {
                  local_90 = ppsVar19;
                  iVar10 = iVar6;
                }
              }
              else if (((int)local_80 + iVar6 <= context->height) &&
                      ((iVar6 < iVar10 || ((iVar6 == iVar10 && (local_84 < local_98)))))) {
                local_98 = local_84;
                local_90 = ppsVar19;
                iVar10 = iVar6;
              }
              ppsVar19 = (stbrp_node **)&psVar16->align;
              uVar2 = (ushort)(*(stbrp_context **)&psVar16->align)->width;
              psVar16 = *(stbrp_context **)&psVar16->align;
            } while ((int)(iVar17 + (uint)uVar2) <= context->width);
          }
          if (local_90 == (stbrp_node **)0x0) {
            local_94 = 0;
          }
          else {
            local_94 = (uint)(*local_90)->x;
          }
          if (context->heuristic == 1) {
            psVar16 = (stbrp_context *)*ppsVar13;
            uVar2 = (ushort)psVar16->width;
            psVar20 = psVar16;
            while ((int)(uint)uVar2 < iVar17) {
              psVar20 = *(stbrp_context **)&psVar20->align;
              uVar2 = (ushort)psVar20->width;
            }
            do {
              uVar12 = (uint)(ushort)psVar20->width - iVar17;
              ppsVar19 = ppsVar13;
              psVar5 = psVar16;
              if ((int)uVar12 < 0) {
                pwaste = "xpos >= 0";
                LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imstb_rectpack.h"
                            ,0x1a8,"stbrp__skyline_find_best_pos","ImGui ASSERT FAILED: %s");
              }
              do {
                psVar16 = psVar5;
                ppsVar13 = ppsVar19;
                ppsVar19 = (stbrp_node **)&psVar16->align;
                psVar5 = *(stbrp_context **)&psVar16->align;
              } while ((int)(uint)(ushort)(*(stbrp_context **)&psVar16->align)->width <= (int)uVar12
                      );
              if ((int)uVar12 < (int)(uint)(ushort)psVar16->width) {
                pwaste = "node->next->x > xpos && node->x <= xpos";
                LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imstb_rectpack.h"
                            ,0x1ae,"stbrp__skyline_find_best_pos","ImGui ASSERT FAILED: %s");
              }
              iVar6 = stbrp__skyline_find_min_y
                                (psVar16,(stbrp_node *)(ulong)uVar12,iVar17,(int)&local_88,
                                 (int *)pwaste);
              if ((((int)local_80 + iVar6 <= local_58->height) && (iVar6 <= iVar10)) &&
                 (((iVar6 < iVar10 || (local_88 < local_98)) ||
                  ((local_88 == local_98 && ((int)uVar12 < (int)local_94)))))) {
                local_98 = local_88;
                local_94 = uVar12;
                local_90 = ppsVar13;
                iVar10 = iVar6;
              }
              psVar20 = *(stbrp_context **)&psVar20->align;
            } while (psVar20 != (stbrp_context *)0x0);
          }
          uVar7 = CONCAT44(iVar10,local_94);
          rects = local_38;
          ppsVar13 = local_48;
          context = local_58;
          uVar18 = local_40;
        }
        uVar11 = local_60;
        if (((local_90 == (stbrp_node **)0x0) ||
            (iVar10 = (int)local_80 + (int)((ulong)uVar7 >> 0x20), context->height < iVar10)) ||
           (psVar3 = context->free_head, psVar3 == (stbrp_node *)0x0)) {
          local_68->x = 0xffff;
          local_68->y = 0xffff;
        }
        else {
          psVar3->x = (stbrp_coord)uVar7;
          psVar3->y = (stbrp_coord)iVar10;
          context->free_head = psVar3->next;
          psVar15 = *local_90;
          iVar10 = (int)uVar7;
          psVar14 = psVar15;
          if ((int)(uint)psVar15->x < iVar10) {
            psVar14 = psVar15->next;
            local_90 = &psVar15->next;
          }
          *local_90 = psVar3;
          if (psVar14->next != (stbrp_node *)0x0) {
            local_90 = &psVar14->next;
            psVar15 = psVar14->next;
            do {
              if (iVar10 + (int)local_70 < (int)(uint)psVar15->x) break;
              *local_90 = context->free_head;
              context->free_head = psVar14;
              local_90 = &psVar15->next;
              ppsVar19 = &psVar15->next;
              psVar14 = psVar15;
              psVar15 = *ppsVar19;
            } while (*ppsVar19 != (stbrp_node *)0x0);
          }
          psVar3->next = psVar14;
          iVar10 = (int)local_70 + iVar10;
          if ((int)(uint)psVar14->x < iVar10) {
            psVar14->x = (stbrp_coord)iVar10;
          }
          local_68->x = (stbrp_coord)uVar7;
          local_68->y = (stbrp_coord)((ulong)uVar7 >> 0x20);
        }
      }
      uVar11 = uVar11 + 1;
    } while (uVar11 != uVar18);
  }
  qsort(rects,local_50,0x10,rect_original_order);
  lVar8 = extraout_RAX;
  if (0 < (int)local_78) {
    lVar8 = 0;
    do {
      bVar21 = true;
      if (*(short *)((long)&rects->x + lVar8) == -1) {
        bVar21 = *(short *)((long)&rects->y + lVar8) != -1;
      }
      *(uint *)((long)&rects->was_packed + lVar8) = (uint)bVar21;
      lVar8 = lVar8 + 0x10;
    } while (uVar18 * 0x10 != lVar8);
  }
  return (int)lVar8;
}

Assistant:

STBRP_DEF int stbrp_pack_rects(stbrp_context *context, stbrp_rect *rects, int num_rects)
{
   int i, all_rects_packed = 1;

   // we use the 'was_packed' field internally to allow sorting/unsorting
   for (i=0; i < num_rects; ++i) {
      rects[i].was_packed = i;
   }

   // sort according to heuristic
   STBRP_SORT(rects, num_rects, sizeof(rects[0]), rect_height_compare);

   for (i=0; i < num_rects; ++i) {
      if (rects[i].w == 0 || rects[i].h == 0) {
         rects[i].x = rects[i].y = 0;  // empty rect needs no space
      } else {
         stbrp__findresult fr = stbrp__skyline_pack_rectangle(context, rects[i].w, rects[i].h);
         if (fr.prev_link) {
            rects[i].x = (stbrp_coord) fr.x;
            rects[i].y = (stbrp_coord) fr.y;
         } else {
            rects[i].x = rects[i].y = STBRP__MAXVAL;
         }
      }
   }

   // unsort
   STBRP_SORT(rects, num_rects, sizeof(rects[0]), rect_original_order);

   // set was_packed flags and all_rects_packed status
   for (i=0; i < num_rects; ++i) {
      rects[i].was_packed = !(rects[i].x == STBRP__MAXVAL && rects[i].y == STBRP__MAXVAL);
      if (!rects[i].was_packed)
         all_rects_packed = 0;
   }

   // return the all_rects_packed status
   return all_rects_packed;
}